

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O0

golf_material_t *
golf_material_diffuse_color
          (golf_material_t *__return_storage_ptr__,char *name,float friction,float vel_scale,
          float restitution,vec4 color)

{
  golf_material_t *material;
  float restitution_local;
  float vel_scale_local;
  float friction_local;
  char *name_local;
  vec4 color_local;
  
  __return_storage_ptr__->active = true;
  snprintf(__return_storage_ptr__->name,0x40,"%s",name);
  __return_storage_ptr__->friction = friction;
  __return_storage_ptr__->restitution = restitution;
  __return_storage_ptr__->vel_scale = vel_scale;
  __return_storage_ptr__->type = GOLF_MATERIAL_DIFFUSE_COLOR;
  *(long *)&__return_storage_ptr__->field_6 = color._0_8_;
  *(long *)((long)&__return_storage_ptr__->field_6 + 8) = color._8_8_;
  return __return_storage_ptr__;
}

Assistant:

golf_material_t golf_material_diffuse_color(const char *name, float friction, float vel_scale, float restitution, vec4 color) {
    golf_material_t material;
    material.active = true;
    snprintf(material.name, GOLF_MAX_NAME_LEN, "%s", name);
    material.friction = friction;
    material.restitution = restitution;
    material.vel_scale = vel_scale;
    material.type = GOLF_MATERIAL_DIFFUSE_COLOR;
    material.color = color;
    return material;
}